

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveCompoundOrderBy(Parse *pParse,Select *pSelect)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *psVar3;
  Expr *pEVar4;
  bool bVar5;
  Select *pSVar6;
  Select *pSVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Expr *pEVar12;
  long lVar13;
  ExprList_item *pEVar14;
  Expr *pE;
  Expr *pEVar15;
  ulong uVar16;
  ExprList *pEVar17;
  int iVar18;
  Expr *p;
  ExprList_item *pEVar19;
  int iCol;
  int local_a8;
  int local_a4;
  Expr *local_a0;
  sqlite3 *local_98;
  ExprList *local_90;
  ExprList_item *local_88;
  Select *local_80;
  Parse *local_78;
  Parse *local_70;
  NameContext local_68;
  
  pEVar17 = pSelect->pOrderBy;
  if (pEVar17 == (ExprList *)0x0) {
    return 0;
  }
  local_98 = pParse->db;
  if (local_98->aLimit[2] < pEVar17->nExpr) {
    sqlite3ErrorMsg(pParse,"too many terms in ORDER BY clause");
  }
  else {
    if (0 < pEVar17->nExpr) {
      lVar11 = 0x19;
      lVar13 = 0;
      do {
        pbVar1 = (byte *)((long)&pEVar17->a->pExpr + lVar11);
        *pbVar1 = *pbVar1 & 0xfe;
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar13 < pEVar17->nExpr);
    }
    pSelect->pNext = (Select *)0x0;
    pSVar7 = pSelect->pPrior;
    while (pSVar6 = pSVar7, pSVar6 != (Select *)0x0) {
      pSVar6->pNext = pSelect;
      pSelect = pSVar6;
      pSVar7 = pSVar6->pPrior;
    }
    iVar18 = 1;
    local_90 = pEVar17;
    local_78 = pParse;
    do {
      if ((pSelect == (Select *)0x0) || (iVar18 == 0)) {
        if ((long)pEVar17->nExpr < 1) {
          return 0;
        }
        uVar16 = 1;
        lVar11 = 0;
        do {
          if (((&pEVar17->a->field_0x19)[lVar11] & 1) == 0) {
            sqlite3ErrorMsg(local_78,"%r ORDER BY term does not match any column in the result set",
                            uVar16);
            return 1;
          }
          uVar16 = (ulong)((int)uVar16 + 1);
          lVar11 = lVar11 + 0x20;
        } while ((long)pEVar17->nExpr * 0x20 != lVar11);
        return 0;
      }
      local_80 = pSelect;
      if (pEVar17->nExpr < 1) {
        local_a4 = 0;
      }
      else {
        local_70 = (Parse *)pSelect->pEList;
        pEVar19 = pEVar17->a;
        iVar18 = 0;
        local_a4 = 0;
        do {
          local_a8 = -1;
          if ((pEVar19->field_0x19 & 1) == 0) {
            p = pEVar19->pExpr;
            while ((p != (Expr *)0x0 && ((p->flags >> 0xc & 1) != 0))) {
              if ((p->flags >> 0x12 & 1) == 0) {
                pEVar14 = (ExprList_item *)&p->pLeft;
              }
              else {
                pEVar14 = ((p->x).pList)->a;
              }
              p = pEVar14->pExpr;
            }
            iVar8 = sqlite3ExprIsInteger(p,&local_a8);
            if (iVar8 == 0) {
              local_a8 = resolveAsName(local_70,(ExprList *)p,pE);
              psVar3 = local_98;
              if (local_a8 == 0) {
                if (p == (Expr *)0x0) {
                  pEVar12 = (Expr *)0x0;
                }
                else {
                  pEVar12 = exprDup(local_98,p,0,(u8 **)0x0);
                }
                iVar8 = local_a8;
                if (psVar3->mallocFailed == '\0') {
                  local_88 = (ExprList_item *)local_80->pEList;
                  local_68.pNext = (NameContext *)0x0;
                  local_68.pAggInfo = (AggInfo *)0x0;
                  local_68.pParse = local_78;
                  local_68.pSrcList = local_80->pSrc;
                  local_68.ncFlags = 1;
                  local_68._50_6_ = 0;
                  local_68.nRef = 0;
                  local_68.nErr = 0;
                  psVar3 = local_78->db;
                  uVar2 = psVar3->suppressErr;
                  psVar3->suppressErr = '\x01';
                  local_a0 = pEVar12;
                  local_68.pEList = (ExprList *)local_88;
                  iVar9 = sqlite3ResolveExprNames(&local_68,pEVar12);
                  psVar3->suppressErr = uVar2;
                  pEVar12 = local_a0;
                  iVar8 = 0;
                  if ((iVar9 == 0) &&
                     (iVar9 = *(int *)&local_88->pExpr, pEVar17 = local_90, 0 < (long)iVar9)) {
                    local_88 = (ExprList_item *)local_88->zName;
                    iVar8 = 1;
                    lVar11 = 0;
                    do {
                      uVar10 = sqlite3ExprCompare(*(Expr **)((long)&local_88->pExpr + lVar11),
                                                  local_a0,-1);
                      pEVar17 = local_90;
                      pEVar12 = local_a0;
                      if (uVar10 < 2) goto LAB_0015ba1e;
                      iVar8 = iVar8 + 1;
                      lVar11 = lVar11 + 0x20;
                    } while ((long)iVar9 * 0x20 != lVar11);
                    iVar8 = 0;
                  }
                }
LAB_0015ba1e:
                local_a8 = iVar8;
                if (pEVar12 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(local_98,pEVar12);
                }
              }
LAB_0015ba2d:
              iVar8 = local_a8;
              bVar5 = true;
              if (local_a8 < 1) {
                iVar8 = 0;
                local_a4 = 1;
              }
              else {
                local_68.pParse = (Parse *)0x0;
                local_68.pSrcList = (SrcList *)((ulong)local_68.pSrcList & 0xffffffff00000000);
                pEVar12 = sqlite3ExprAlloc(local_98,0x86,(Token *)&local_68,0);
                if (pEVar12 == (Expr *)0x0) {
                  iVar8 = 1;
                  goto LAB_0015b89a;
                }
                pbVar1 = (byte *)((long)&pEVar12->flags + 1);
                *pbVar1 = *pbVar1 | 4;
                (pEVar12->u).iValue = iVar8;
                pEVar14 = pEVar19;
                pEVar4 = pEVar19->pExpr;
                if (pEVar19->pExpr != p) {
                  do {
                    pEVar15 = pEVar4;
                    pEVar4 = pEVar15->pLeft;
                  } while (pEVar4->op == '5');
                  pEVar14 = (ExprList_item *)&pEVar15->pLeft;
                }
                pEVar14->pExpr = pEVar12;
                if (p != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(local_98,p);
                }
                (pEVar19->u).x.iOrderByCol = (u16)local_a8;
                pEVar19->field_0x19 = pEVar19->field_0x19 | 1;
                iVar8 = 0;
              }
            }
            else {
              if ((0 < local_a8) && (local_a8 <= *(int *)&local_70->db)) goto LAB_0015ba2d;
              bVar5 = false;
              sqlite3ErrorMsg(local_78,"%r %s BY term out of range - should be between 1 and %d",
                              (ulong)(iVar18 + 1),"ORDER",(ulong)*(uint *)&local_70->db);
              iVar8 = 1;
            }
          }
          else {
            iVar8 = 0xb;
LAB_0015b89a:
            bVar5 = false;
          }
          if ((iVar8 != 0xb) && (pSelect = local_80, iVar8 != 0)) goto LAB_0015baf9;
          iVar18 = iVar18 + 1;
          pEVar19 = pEVar19 + 1;
        } while (iVar18 < pEVar17->nExpr);
      }
      bVar5 = true;
      pSelect = local_80->pNext;
LAB_0015baf9:
      iVar18 = local_a4;
    } while (bVar5);
  }
  return 1;
}

Assistant:

static int resolveCompoundOrderBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect       /* The SELECT statement containing the ORDER BY */
){
  int i;
  ExprList *pOrderBy;
  ExprList *pEList;
  sqlite3 *db;
  int moreToDo = 1;

  pOrderBy = pSelect->pOrderBy;
  if( pOrderBy==0 ) return 0;
  db = pParse->db;
#if SQLITE_MAX_COLUMN
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in ORDER BY clause");
    return 1;
  }
#endif
  for(i=0; i<pOrderBy->nExpr; i++){
    pOrderBy->a[i].done = 0;
  }
  pSelect->pNext = 0;
  while( pSelect->pPrior ){
    pSelect->pPrior->pNext = pSelect;
    pSelect = pSelect->pPrior;
  }
  while( pSelect && moreToDo ){
    struct ExprList_item *pItem;
    moreToDo = 0;
    pEList = pSelect->pEList;
    assert( pEList!=0 );
    for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
      int iCol = -1;
      Expr *pE, *pDup;
      if( pItem->done ) continue;
      pE = sqlite3ExprSkipCollate(pItem->pExpr);
      if( sqlite3ExprIsInteger(pE, &iCol) ){
        if( iCol<=0 || iCol>pEList->nExpr ){
          resolveOutOfRangeError(pParse, "ORDER", i+1, pEList->nExpr);
          return 1;
        }
      }else{
        iCol = resolveAsName(pParse, pEList, pE);
        if( iCol==0 ){
          pDup = sqlite3ExprDup(db, pE, 0);
          if( !db->mallocFailed ){
            assert(pDup);
            iCol = resolveOrderByTermToExprList(pParse, pSelect, pDup);
          }
          sqlite3ExprDelete(db, pDup);
        }
      }
      if( iCol>0 ){
        /* Convert the ORDER BY term into an integer column number iCol,
        ** taking care to preserve the COLLATE clause if it exists */
        Expr *pNew = sqlite3Expr(db, TK_INTEGER, 0);
        if( pNew==0 ) return 1;
        pNew->flags |= EP_IntValue;
        pNew->u.iValue = iCol;
        if( pItem->pExpr==pE ){
          pItem->pExpr = pNew;
        }else{
          Expr *pParent = pItem->pExpr;
          assert( pParent->op==TK_COLLATE );
          while( pParent->pLeft->op==TK_COLLATE ) pParent = pParent->pLeft;
          assert( pParent->pLeft==pE );
          pParent->pLeft = pNew;
        }
        sqlite3ExprDelete(db, pE);
        pItem->u.x.iOrderByCol = (u16)iCol;
        pItem->done = 1;
      }else{
        moreToDo = 1;
      }
    }
    pSelect = pSelect->pNext;
  }
  for(i=0; i<pOrderBy->nExpr; i++){
    if( pOrderBy->a[i].done==0 ){
      sqlite3ErrorMsg(pParse, "%r ORDER BY term does not match any "
            "column in the result set", i+1);
      return 1;
    }
  }
  return 0;
}